

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O0

int __thiscall cmConfigureFileCommand::ConfigureFile(cmConfigureFileCommand *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *infile;
  char *outfile;
  cmConfigureFileCommand *this_local;
  
  this_00 = (this->super_cmCommand).Makefile;
  infile = (char *)std::__cxx11::string::c_str();
  outfile = (char *)std::__cxx11::string::c_str();
  iVar1 = cmMakefile::ConfigureFile
                    (this_00,infile,outfile,(bool)(this->CopyOnly & 1),(bool)(this->AtOnly & 1),
                     (bool)(this->EscapeQuotes & 1),&this->NewLineStyle);
  return iVar1;
}

Assistant:

int cmConfigureFileCommand::ConfigureFile()
{
  return this->Makefile->ConfigureFile(
    this->InputFile.c_str(),
    this->OutputFile.c_str(),
    this->CopyOnly,
    this->AtOnly,
    this->EscapeQuotes,
    this->NewLineStyle);
}